

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

String * __thiscall
kj::encodeWwwForm(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  kj kVar1;
  uint uVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *puVar5;
  Vector<char> local_58;
  String *local_38;
  
  puVar3 = bytes.ptr;
  local_38 = __return_storage_ptr__;
  local_58.builder.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (1,0,(size_t)(puVar3 + 1),(_func_void_void_ptr *)0x0,
                          (_func_void_void_ptr *)0x0);
  local_58.builder.endPtr = (char *)((kj *)local_58.builder.ptr + (long)puVar3 + 1);
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.builder.pos = local_58.builder.ptr;
  if (puVar3 != (uchar *)0x0) {
    puVar5 = (uchar *)0x0;
    do {
      kVar1 = this[(long)puVar5];
      if (((byte)((char)kVar1 - 0x30U) < 10) || ((byte)(((byte)kVar1 & 0xdf) + 0xbf) < 0x1a)) {
LAB_001e4b65:
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.endPtr == local_58.builder.ptr) {
            sVar4 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar4);
        }
        *local_58.builder.pos = (RemoveConst<char>)kVar1;
      }
      else {
        uVar2 = (byte)kVar1 - 0x20;
        if (uVar2 < 0x40) {
          if ((0x8000000000006400U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_001e4b65;
          if ((ulong)uVar2 != 0) goto LAB_001e4be8;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar4 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar4);
          }
          *local_58.builder.pos = '+';
        }
        else {
LAB_001e4be8:
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar4 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar4);
          }
          *local_58.builder.pos = '%';
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar4 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar4);
          }
          *local_58.builder.pos =
               (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 >> 4));
          local_58.builder.pos = local_58.builder.pos + 1;
          if (local_58.builder.pos == local_58.builder.endPtr) {
            sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
            if (local_58.builder.endPtr == local_58.builder.ptr) {
              sVar4 = 4;
            }
            Vector<char>::setCapacity(&local_58,sVar4);
          }
          *local_58.builder.pos =
               (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 & 0xf));
        }
      }
      local_58.builder.pos = local_58.builder.pos + 1;
      puVar5 = puVar5 + 1;
    } while (puVar3 != puVar5);
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar4 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar4 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar4);
  }
  *local_58.builder.pos = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (local_38->content).ptr = local_58.builder.ptr;
  (local_38->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->content).disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

String encodeWwwForm(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('A' <= b && b <= 'Z') ||
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= '9') ||
        b == '-' || b == '_' || b == '.' || b == '*') {
      result.add(b);
    } else if (b == ' ') {
      result.add('+');
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}